

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O2

void * Tests::FindVar(char *name)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  lVar3 = symbols;
  lVar2 = varInfo;
  uVar6 = (ulong)variableCount;
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 0x10;
    if (uVar6 * 0x10 + 0x10 == lVar1) {
      return (void *)0x0;
    }
    iVar4 = strcmp(name,(char *)((ulong)*(uint *)(lVar2 + lVar5) + lVar3));
    lVar5 = lVar1;
  } while (iVar4 != 0);
  return (void *)((ulong)*(uint *)(lVar2 + -4 + lVar1) + varData);
}

Assistant:

void* Tests::FindVar(const char* name)
{
	for(unsigned int i = 0; i < variableCount; i++)
	{
		if(strcmp(name, symbols + varInfo[i].offsetToName) == 0)
			return (void*)(varData + varInfo[i].offset);
	}
	return NULL;
}